

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,ON_SubDEdge *e)

{
  ushort uVar1;
  ulong uVar2;
  ON_SubDEdgePtr *pOVar3;
  long lVar4;
  ulong uVar5;
  
  if (e != (ON_SubDEdge *)0x0) {
    uVar1 = this->m_edge_count;
    uVar2 = (ulong)uVar1;
    if (uVar2 < 5) {
      for (lVar4 = 0x15; lVar4 - uVar2 != 0x15; lVar4 = lVar4 + 1) {
        if ((ON_SubDEdge *)
            ((ulong)(this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -4] &
            0xfffffffffffffff8) == e) goto LAB_005d4df1;
      }
    }
    else {
      for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
        if ((ON_SubDEdge *)(this->m_edge4[uVar5].m_ptr & 0xfffffffffffffff8) == e)
        goto LAB_005d4e3c;
      }
      pOVar3 = this->m_edgex;
      for (uVar5 = 5; (4 - uVar2) + uVar5 != 5; uVar5 = uVar5 + 1) {
        if ((ON_SubDEdge *)(pOVar3[uVar5 - 5].m_ptr & 0xfffffffffffffff8) == e) goto LAB_005d4ea7;
      }
    }
  }
  return false;
LAB_005d4ea7:
  for (; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    pOVar3[uVar5 - 5].m_ptr = pOVar3[uVar5 - 4].m_ptr;
  }
  goto LAB_005d4eac;
LAB_005d4df1:
  for (; lVar4 - 0x14U < uVar2; lVar4 = lVar4 + 1) {
    (this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -4] =
         (this->super_ON_SubDComponentBase).m_saved_subd_point1[lVar4 + -3];
  }
  this->m_edge_count = uVar1 - 1;
  pOVar3 = this->m_edge4 + (ushort)(uVar1 - 1);
  goto LAB_005d4ec0;
LAB_005d4e3c:
  for (; uVar5 < 3; uVar5 = uVar5 + 1) {
    this->m_edge4[uVar5].m_ptr = this->m_edge4[uVar5 + 1].m_ptr;
  }
  pOVar3 = this->m_edgex;
  this->m_edge4[3].m_ptr = pOVar3->m_ptr;
  for (lVar4 = 0; uVar2 - 5 != lVar4; lVar4 = lVar4 + 1) {
    pOVar3[lVar4].m_ptr = pOVar3[lVar4 + 1].m_ptr;
  }
LAB_005d4eac:
  this->m_edge_count = uVar1 - 1;
  pOVar3 = pOVar3 + ((ulong)(ushort)(uVar1 - 1) - 4);
LAB_005d4ec0:
  pOVar3->m_ptr = 0;
  return true;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  const ON_SubDEdge* e
  )
{
  unsigned int i;
  if (nullptr == e)
    return false;

  if (m_edge_count <= 4)
  {
    for (i = 0; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge_count--;
        m_edge4[m_edge_count] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 4; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edge4[i].m_ptr))
      {
        for (i++; i < 4; i++)
          m_edge4[i - 1] = m_edge4[i];
        m_edge4[3] = m_edgex[0];
        for (i = 5; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
    for (i = 4; i < m_edge_count; i++)
    {
      if (e == ON_SUBD_EDGE_POINTER(m_edgex[i - 4].m_ptr))
      {
        for (i++; i < m_edge_count; i++)
          m_edgex[i - 5] = m_edgex[i - 4];
        m_edge_count--;
        m_edgex[m_edge_count-4] = ON_SubDEdgePtr::Null;
        return true;
      }
    }
  }

  return false;
}